

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O0

OptionBase<Inferences::BwSimplificationRecord> * __thiscall
Lib::OptionBase<Inferences::BwSimplificationRecord>::operator=
          (OptionBase<Inferences::BwSimplificationRecord> *this,
          OptionBase<Inferences::BwSimplificationRecord> *other)

{
  BwSimplificationRecord *t;
  byte *in_RSI;
  OptionBase<Inferences::BwSimplificationRecord> *in_RDI;
  BwSimplificationRecord local_20;
  byte *local_10;
  
  local_10 = in_RSI;
  if ((in_RDI->_isSome & 1U) != 0) {
    unwrap((OptionBase<Inferences::BwSimplificationRecord> *)0x76b147);
  }
  if ((*local_10 & 1) != 0) {
    t = unwrap((OptionBase<Inferences::BwSimplificationRecord> *)0x76b169);
    local_20 = move_if_value<Inferences::BwSimplificationRecord,_true>(t);
    MaybeUninit<Inferences::BwSimplificationRecord>::init(&in_RDI->_elem,(EVP_PKEY_CTX *)&local_20);
  }
  in_RDI->_isSome = (bool)(*local_10 & 1);
  return in_RDI;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }